

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O0

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::
make_constraint<spvtools::opt::DependenceLine,spvtools::opt::SENode*&,spvtools::opt::SENode*&,spvtools::opt::SENode*&,spvtools::opt::Loop_const*&>
          (LoopDependenceAnalysis *this,SENode **args,SENode **args_1,SENode **args_2,Loop **args_3)

{
  DependenceLine *this_00;
  reference this_01;
  pointer pCVar1;
  value_type local_38;
  Loop **local_30;
  Loop **args_local_3;
  SENode **args_local_2;
  SENode **args_local_1;
  SENode **args_local;
  LoopDependenceAnalysis *this_local;
  
  local_30 = args_3;
  args_local_3 = (Loop **)args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (SENode **)this;
  this_00 = (DependenceLine *)operator_new(0x28);
  DependenceLine::DependenceLine
            (this_00,*args_local_1,*args_local_2,(SENode *)*args_local_3,*local_30);
  std::unique_ptr<spvtools::opt::Constraint,std::default_delete<spvtools::opt::Constraint>>::
  unique_ptr<std::default_delete<spvtools::opt::Constraint>,void>
            ((unique_ptr<spvtools::opt::Constraint,std::default_delete<spvtools::opt::Constraint>> *
             )&local_38,(pointer)this_00);
  std::__cxx11::
  list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ::push_back(&this->constraints_,&local_38);
  std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>::
  ~unique_ptr(&local_38);
  this_01 = std::__cxx11::
            list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
            ::back(&this->constraints_);
  pCVar1 = std::
           unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>::
           get(this_01);
  return pCVar1;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }